

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  float fVar1;
  ImVec2 local_40;
  ImVec2 local_38;
  float local_30;
  float local_2c;
  float text_base_offset;
  float line_height;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *pIStack_10;
  float text_offset_y_local;
  ImVec2 *size_local;
  
  window = (ImGuiWindow *)GImGui;
  _text_base_offset = GImGui->CurrentWindow;
  if ((_text_base_offset->SkipItems & 1U) == 0) {
    g._4_4_ = text_offset_y;
    pIStack_10 = size;
    local_2c = ImMax<float>((_text_base_offset->DC).CurrentLineHeight,size->y);
    local_30 = ImMax<float>((_text_base_offset->DC).CurrentLineTextBaseOffset,g._4_4_);
    ImVec2::ImVec2(&local_38,(_text_base_offset->DC).CursorPos.x + pIStack_10->x,
                   (_text_base_offset->DC).CursorPos.y);
    (_text_base_offset->DC).CursorPosPrevLine = local_38;
    ImVec2::ImVec2(&local_40,
                   (float)(int)((_text_base_offset->Pos).x + (_text_base_offset->DC).IndentX +
                               (_text_base_offset->DC).ColumnsOffsetX),
                   (float)(int)((_text_base_offset->DC).CursorPos.y + local_2c +
                               (float)window[5].MenuColumns.Count));
    (_text_base_offset->DC).CursorPos = local_40;
    fVar1 = ImMax<float>((_text_base_offset->DC).CursorMaxPos.x,
                         (_text_base_offset->DC).CursorPosPrevLine.x);
    (_text_base_offset->DC).CursorMaxPos.x = fVar1;
    fVar1 = ImMax<float>((_text_base_offset->DC).CursorMaxPos.y,
                         (_text_base_offset->DC).CursorPos.y - (float)window[5].MenuColumns.Count);
    (_text_base_offset->DC).CursorMaxPos.y = fVar1;
    (_text_base_offset->DC).PrevLineHeight = local_2c;
    (_text_base_offset->DC).PrevLineTextBaseOffset = local_30;
    (_text_base_offset->DC).CurrentLineTextBaseOffset = 0.0;
    (_text_base_offset->DC).CurrentLineHeight = 0.0;
    if ((_text_base_offset->DC).LayoutType == 1) {
      SameLine(0.0,-1.0);
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrentLineHeight, size.y);
    const float text_base_offset = ImMax(window->DC.CurrentLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine = ImVec2(window->DC.CursorPos.x + size.x, window->DC.CursorPos.y);
    window->DC.CursorPos = ImVec2((float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX), (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y));
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineHeight = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrentLineHeight = window->DC.CurrentLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}